

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CreateSortKeyBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  PhysicalType type;
  byte bVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  pointer pEVar5;
  type expr;
  pointer pCVar6;
  reference this_00;
  pointer puVar7;
  idx_t iVar8;
  BinderException *pBVar9;
  pointer puVar10;
  idx_t i;
  ulong uVar11;
  ulong uVar12;
  OrderModifiers local_ca;
  _Head_base<0UL,_duckdb::CreateSortKeyBindData_*,_false> local_c8;
  ScalarFunction *local_c0;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_b8;
  string sort_specifier_str;
  Value sort_specifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c0 = bound_function;
  local_b8._M_head_impl = (FunctionData *)this;
  if ((*(int *)&(arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
       *(int *)&(arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start & 8U) != 0) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&sort_specifier,
               "Arguments to create_sort_key must be [key1, sort_specifier1, key2, sort_specifier2, ...]"
               ,(allocator *)&sort_specifier_str);
    BinderException::BinderException(pBVar9,(string *)&sort_specifier);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  make_uniq<duckdb::CreateSortKeyBindData>();
  uVar12 = 1;
  while( true ) {
    puVar7 = (arguments->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar10 = (arguments->
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)puVar10 - (long)puVar7 >> 3) <= uVar12) {
      for (uVar12 = 0; uVar12 < (ulong)((long)puVar10 - (long)puVar7 >> 3); uVar12 = uVar12 + 2) {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,uVar12);
        this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>(arguments,uVar12);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_00);
        ExpressionBinder::PushCollation(context,pvVar4,&pEVar5->return_type,ALL_COLLATIONS);
        puVar7 = (arguments->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar10 = (arguments->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      bVar1 = 1;
      uVar11 = 0;
      for (uVar12 = 0; uVar12 < (ulong)((long)puVar10 - (long)puVar7 >> 3); uVar12 = uVar12 + 2) {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,uVar12);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar4);
        type = (pEVar5->return_type).physical_type_;
        bVar2 = TypeIsConstantSize(type);
        if (bVar2) {
          iVar8 = GetTypeIdSize(type);
          uVar11 = uVar11 + iVar8 + 1;
        }
        else {
          bVar1 = 0;
        }
        puVar7 = (arguments->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar10 = (arguments->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if ((bool)(bVar1 & uVar11 < 9)) {
        LogicalType::LogicalType(&sort_specifier.type_,BIGINT);
        LogicalType::operator=
                  (&(local_c0->super_BaseScalarFunction).return_type,&sort_specifier.type_);
        LogicalType::~LogicalType(&sort_specifier.type_);
      }
      (local_b8._M_head_impl)->_vptr_FunctionData = (_func_int **)local_c8._M_head_impl;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             local_b8._M_head_impl;
    }
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,uVar12);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    iVar3 = (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar5);
    if ((char)iVar3 == '\0') break;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,uVar12);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar4);
    ExpressionExecutor::EvaluateScalar(&sort_specifier,context,expr,false);
    if (sort_specifier.is_null == true) {
      pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&sort_specifier_str,"sort_specifier cannot be NULL",
                 (allocator *)&local_ca);
      BinderException::BinderException(pBVar9,&sort_specifier_str);
      __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::ToString_abi_cxx11_(&sort_specifier_str,&sort_specifier);
    pCVar6 = unique_ptr<duckdb::CreateSortKeyBindData,_std::default_delete<duckdb::CreateSortKeyBindData>,_true>
             ::operator->((unique_ptr<duckdb::CreateSortKeyBindData,_std::default_delete<duckdb::CreateSortKeyBindData>,_true>
                           *)&local_c8);
    local_ca = OrderModifiers::Parse(&sort_specifier_str);
    ::std::vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>::
    emplace_back<duckdb::OrderModifiers>
              (&(pCVar6->modifiers).
                super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>,
               &local_ca);
    ::std::__cxx11::string::~string((string *)&sort_specifier_str);
    Value::~Value(&sort_specifier);
    uVar12 = uVar12 + 2;
  }
  pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&sort_specifier,"sort_specifier must be a constant value - but got %s",
             (allocator *)&sort_specifier_str);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,uVar12);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pEVar5);
  BinderException::BinderException<std::__cxx11::string>(pBVar9,(string *)&sort_specifier,&local_50)
  ;
  __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> CreateSortKeyBind(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {
	if (arguments.size() % 2 != 0) {
		throw BinderException(
		    "Arguments to create_sort_key must be [key1, sort_specifier1, key2, sort_specifier2, ...]");
	}
	auto result = make_uniq<CreateSortKeyBindData>();
	for (idx_t i = 1; i < arguments.size(); i += 2) {
		if (!arguments[i]->IsFoldable()) {
			throw BinderException("sort_specifier must be a constant value - but got %s", arguments[i]->ToString());
		}

		// Rebind to return a date if we are truncating that far
		Value sort_specifier = ExpressionExecutor::EvaluateScalar(context, *arguments[i]);
		if (sort_specifier.IsNull()) {
			throw BinderException("sort_specifier cannot be NULL");
		}
		auto sort_specifier_str = sort_specifier.ToString();
		result->modifiers.push_back(OrderModifiers::Parse(sort_specifier_str));
	}
	// push collations
	for (idx_t i = 0; i < arguments.size(); i += 2) {
		ExpressionBinder::PushCollation(context, arguments[i], arguments[i]->return_type);
	}
	// check if all types are constant
	bool all_constant = true;
	idx_t constant_size = 0;
	for (idx_t i = 0; i < arguments.size(); i += 2) {
		auto physical_type = arguments[i]->return_type.InternalType();
		if (!TypeIsConstantSize(physical_type)) {
			all_constant = false;
		} else {
			// we always add one byte for the validity
			constant_size += GetTypeIdSize(physical_type) + 1;
		}
	}
	if (all_constant) {
		if (constant_size <= sizeof(int64_t)) {
			bound_function.return_type = LogicalType::BIGINT;
		}
	}
	return std::move(result);
}